

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::UListLeaf::~UListLeaf
          (UListLeaf *this)

{
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *pLVar1;
  Term *this_00;
  LDList *pLVar2;
  
  (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__UListLeaf_00b2ee70;
  pLVar1 = this->_children;
  if (this->_children == (LDList *)0x0) {
    (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__Node_00b2ef18;
    this_00 = (Term *)(this->super_Leaf).super_Node._term._content;
    if (((ulong)this_00 & 3) == 0) {
      Kernel::Term::destroyNonShared(this_00);
    }
    return;
  }
  do {
    pLVar2 = pLVar1;
    pLVar1 = pLVar2->_tail;
    *(undefined8 *)
     &(pLVar2->_head).super_SelectedEquality._inner._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
         = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pLVar2;
  } while (pLVar1 != (List<Inferences::ALASCA::SuperpositionConf::Lhs> *)0x0);
  SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node::~Node((Node *)this);
  return;
}

Assistant:

~UListLeaf()
  {
    LDList::destroy(_children);
  }